

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O1

Var __thiscall
Js::DataView::GetValueWithCheck<double,double*>
          (DataView *this,Var offset,BOOL isLittleEndian,char16 *funcName)

{
  uint uVar1;
  ScriptContext *scriptContext;
  uchar *puVar2;
  ulong uVar3;
  uint32 uVar4;
  double value;
  Var pvVar5;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  uVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  if (uVar1 < 8) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec1f,funcName);
  }
  uVar4 = ArrayBuffer::ToIndex(offset,-0x7ff5ec1f,scriptContext,uVar1 - 8,false);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
    puVar2 = (this->buffer).ptr;
    if (isLittleEndian == 0) {
      uVar3 = *(ulong *)(puVar2 + uVar4);
      value = (double)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                       (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                       (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
    }
    else {
      value = *(double *)(puVar2 + uVar4);
    }
    pvVar5 = JavascriptNumber::ToVarWithCheck
                       (value,(((((this->super_ArrayBufferParent).super_ArrayObject.
                                  super_DynamicObject.super_RecyclableObject.type.ptr)->
                                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                              ptr);
    return pvVar5;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,funcName);
}

Assistant:

Var GetValueWithCheck(Var offset, BOOL isLittleEndian, const char16* funcName)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName item;
            TypeName *typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(typedBuffer, &item);
            }
            else
            {
                item = *static_cast<PointerAccessTypeName>(typedBuffer);
            }
            return JavascriptNumber::ToVarWithCheck(item, GetScriptContext());
        }